

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<float>::genFixeds
          (DefaultSampling<float> *this,FloatFormat *format,
          vector<float,_std::allocator<float>_> *dst)

{
  int __exponent;
  int iVar1;
  float *pfVar2;
  iterator iVar3;
  int iVar4;
  float fVar5;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  iVar4 = format->m_minExp;
  __exponent = format->m_maxExp;
  iVar1 = format->m_fractionBits;
  local_34 = ldexpf(1.0,iVar4 - iVar1);
  local_38 = ldexpf(1.0,iVar4);
  local_28 = ldexpf(1.0,__exponent - iVar1);
  local_40 = NAN;
  iVar3._M_current =
       (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar3._M_current == pfVar2) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
    iVar3._M_current =
         (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = NAN;
    iVar3._M_current = iVar3._M_current + 1;
    (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  local_40 = 0.0;
  if (iVar3._M_current == pfVar2) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
  }
  else {
    *iVar3._M_current = 0.0;
    (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_2c = local_38 - local_34;
  local_30 = local_34 + local_38;
  iVar4 = -3;
  do {
    local_3c = (float)(iVar4 + 2);
    local_40 = local_34 * local_3c;
    iVar3._M_current =
         (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
      iVar3._M_current =
           (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_40;
      iVar3._M_current = iVar3._M_current + 1;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current;
    }
    local_40 = local_2c * local_3c;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
      iVar3._M_current =
           (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_40;
      iVar3._M_current = iVar3._M_current + 1;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current;
    }
    local_40 = local_38 * local_3c;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
      iVar3._M_current =
           (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_40;
      iVar3._M_current = iVar3._M_current + 1;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current;
    }
    local_40 = local_30 * local_3c;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
      iVar3._M_current =
           (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_40;
      iVar3._M_current = iVar3._M_current + 1;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current;
    }
    local_40 = local_3c * 0.5;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
      iVar3._M_current =
           (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_40;
      iVar3._M_current = iVar3._M_current + 1;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current;
    }
    if (iVar3._M_current == pfVar2) {
      local_40 = local_3c;
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
      iVar3._M_current =
           (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_3c;
      iVar3._M_current = iVar3._M_current + 1;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current;
    }
    local_40 = local_3c + local_3c;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
    }
    else {
      *iVar3._M_current = local_40;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    local_24 = ldexpf(1.0,__exponent);
    fVar5 = ldexpf(1.0,__exponent);
    local_40 = ((fVar5 - local_28) + local_24) * local_3c;
    iVar3._M_current =
         (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
      iVar3._M_current =
           (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_40;
      iVar3._M_current = iVar3._M_current + 1;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current;
    }
    local_40 = local_3c * INFINITY;
    if (iVar3._M_current == pfVar2) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(dst,iVar3,&local_40);
    }
    else {
      *iVar3._M_current = local_40;
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    iVar4 = iVar4 + 2;
  } while (iVar4 < 0);
  return;
}

Assistant:

void DefaultSampling<float>::genFixeds (const FloatFormat& format, vector<float>& dst) const
{
	const int			minExp			= format.getMinExp();
	const int			maxExp			= format.getMaxExp();
	const int			fractionBits	= format.getFractionBits();
	const float			minQuantum		= deFloatLdExp(1.0f, minExp - fractionBits);
	const float			minNormalized	= deFloatLdExp(1.0f, minExp);
	const float			maxQuantum		= deFloatLdExp(1.0f, maxExp - fractionBits);

	// NaN
	dst.push_back(TCU_NAN);
	// Zero
	dst.push_back(0.0f);

	for (int sign = -1; sign <= 1; sign += 2)
	{
		// Smallest subnormal
		dst.push_back((float)sign * minQuantum);

		// Largest subnormal
		dst.push_back((float)sign * (minNormalized - minQuantum));

		// Smallest normalized
		dst.push_back((float)sign * minNormalized);

		// Next smallest normalized
		dst.push_back((float)sign * (minNormalized + minQuantum));

		dst.push_back((float)sign * 0.5f);
		dst.push_back((float)sign * 1.0f);
		dst.push_back((float)sign * 2.0f);

		// Largest number
		dst.push_back((float)sign * (deFloatLdExp(1.0f, maxExp) +
									(deFloatLdExp(1.0f, maxExp) - maxQuantum)));

		dst.push_back((float)sign * TCU_INFINITY);
	}
}